

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

void htmlParseComment(htmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  xmlChar *pxVar2;
  commentSAXFunc p_Var3;
  uint val;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  xmlChar *pxVar8;
  long lVar9;
  uint uVar10;
  xmlParserInputPtr pxVar11;
  ulong uVar12;
  xmlChar *pxVar13;
  int iVar14;
  int l;
  int rl;
  int nl;
  int local_6c;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  int local_3c;
  long local_38;
  
  if (ctxt->token == 0) {
    pxVar11 = ctxt->input;
    pxVar8 = pxVar11->cur;
    if ((((*pxVar8 == '<') && (pxVar8[1] == '!')) && (pxVar8[2] == '-')) && (pxVar8[3] == '-')) {
      xVar1 = ctxt->instate;
      ctxt->instate = XML_PARSER_COMMENT;
      if ((500 < (long)pxVar8 - (long)pxVar11->base) && ((long)pxVar11->end - (long)pxVar8 < 500)) {
        xmlParserInputShrink(pxVar11);
        pxVar11 = ctxt->input;
        pxVar8 = pxVar11->cur;
      }
      pxVar11->cur = pxVar8 + 4;
      pxVar11->col = pxVar11->col + 4;
      pxVar8 = (xmlChar *)(*xmlMallocAtomic)(100);
      if (pxVar8 == (xmlChar *)0x0) {
        htmlErrMemory(ctxt,"buffer allocation failed\n");
      }
      else {
        *pxVar8 = '\0';
        val = htmlCurrentChar(ctxt,&local_3c);
        if (val == 0) goto LAB_0014c513;
        pxVar13 = pxVar8;
        if (val != 0x3e) {
          pxVar11 = ctxt->input;
          pxVar2 = pxVar11->cur;
          if (*pxVar2 == '\n') {
            pxVar11->line = pxVar11->line + 1;
            pxVar11->col = 1;
          }
          else {
            pxVar11->col = pxVar11->col + 1;
          }
          ctxt->token = 0;
          uVar12 = (ulong)local_3c;
          pxVar11->cur = pxVar2 + uVar12;
          uVar4 = htmlCurrentChar(ctxt,(int *)&local_50);
          if (uVar4 == 0) {
LAB_0014c513:
            htmlParseErr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment not terminated \n<!--%.50s\n",
                         pxVar8,(xmlChar *)0x0);
            (*xmlFree)(pxVar8);
            return;
          }
          if (uVar4 != 0x3e || val != 0x2d) {
            pxVar11 = ctxt->input;
            pxVar2 = pxVar11->cur;
            if (*pxVar2 == '\n') {
              pxVar11->line = pxVar11->line + 1;
              pxVar11->col = 1;
            }
            else {
              pxVar11->col = pxVar11->col + 1;
            }
            ctxt->token = 0;
            local_48 = (ulong)(int)local_50;
            pxVar11->cur = pxVar2 + local_48;
            uVar5 = htmlCurrentChar(ctxt,(int *)&local_54);
            iVar14 = 0;
            if (uVar5 == 0) {
              lVar9 = 0;
            }
            else {
              local_6c = 100;
              do {
                if (((val == 0x2d) && (uVar4 == 0x2d)) && (uVar5 == 0x3e)) goto LAB_0014c244;
                pxVar11 = ctxt->input;
                pxVar8 = pxVar11->cur;
                if (*pxVar8 == '\n') {
                  pxVar11->line = pxVar11->line + 1;
                  pxVar11->col = 1;
                }
                else {
                  pxVar11->col = pxVar11->col + 1;
                }
                ctxt->token = 0;
                local_38 = (long)(int)local_54;
                pxVar11->cur = pxVar8 + local_38;
                uVar6 = htmlCurrentChar(ctxt,(int *)&local_4c);
                if (uVar6 == 0) {
                  pxVar11 = ctxt->input;
                  if ((500 < (long)pxVar11->cur - (long)pxVar11->base) &&
                     ((long)pxVar11->end - (long)pxVar11->cur < 500)) {
                    xmlParserInputShrink(pxVar11);
                  }
                  if ((ctxt->progressive == 0) &&
                     (pxVar11 = ctxt->input, (long)pxVar11->end - (long)pxVar11->cur < 0xfa)) {
                    xmlParserInputGrow(pxVar11,0xfa);
                  }
                  uVar6 = htmlCurrentChar(ctxt,(int *)&local_4c);
                }
                if (uVar6 == 0x3e && (uVar5 == 0x21 && (uVar4 == 0x2d && val == 0x2d))) {
                  htmlParseErr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,
                               "Comment incorrectly closed by \'--!>\'",(xmlChar *)0x0,
                               (xmlChar *)0x0);
                  goto LAB_0014c244;
                }
                pxVar8 = pxVar13;
                iVar7 = local_6c;
                if (local_6c <= iVar14 + 5) {
                  local_6c = local_6c * 2;
                  iVar7 = local_6c;
                  pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar13,(long)local_6c);
                  if (pxVar8 == (xmlChar *)0x0) {
                    (*xmlFree)(pxVar13);
                    htmlErrMemory(ctxt,"growing buffer failed\n");
                    ctxt->instate = xVar1;
                    return;
                  }
                }
                if ((int)val < 0x100) {
                  if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
                  goto LAB_0014c445;
LAB_0014c4a6:
                  htmlParseErrInt(ctxt,0x1ed77a,(char *)(ulong)val,iVar7);
LAB_0014c4d0:
                  local_50 = (uint)local_48;
                  uVar10 = (uint)local_38;
                }
                else {
                  uVar10 = val - 0xe000;
                  iVar7 = CONCAT31((int3)(uVar10 >> 8),uVar10 < 0x1ffe || val < 0xd800);
                  if (0xfffff < val - 0x10000 && (uVar10 >= 0x1ffe && val >= 0xd800))
                  goto LAB_0014c4a6;
LAB_0014c445:
                  if ((int)uVar12 != 1) {
                    iVar7 = xmlCopyChar((int)uVar12,pxVar8 + iVar14,val);
                    iVar14 = iVar7 + iVar14;
                    goto LAB_0014c4d0;
                  }
                  pxVar8[iVar14] = (xmlChar)val;
                  uVar10 = local_54;
                  iVar14 = iVar14 + 1;
                }
                uVar12 = (ulong)local_50;
                local_54 = local_4c;
                local_48 = (ulong)uVar10;
                pxVar13 = pxVar8;
                val = uVar4;
                uVar4 = uVar5;
                uVar5 = uVar6;
                local_50 = uVar10;
              } while (uVar6 != 0);
              lVar9 = (long)iVar14;
            }
            pxVar8[lVar9] = '\0';
            goto LAB_0014c513;
          }
        }
        iVar14 = 0;
        htmlParseErr(ctxt,XML_ERR_COMMENT_ABRUPTLY_ENDED,"Comment abruptly ended",(xmlChar *)0x0,
                     (xmlChar *)0x0);
LAB_0014c244:
        pxVar13[iVar14] = '\0';
        xmlNextChar(ctxt);
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
            (p_Var3 = ctxt->sax->comment, p_Var3 != (commentSAXFunc)0x0)) && (ctxt->disableSAX == 0)
           ) {
          (*p_Var3)(ctxt->userData,pxVar13);
        }
        (*xmlFree)(pxVar13);
      }
      ctxt->instate = xVar1;
    }
  }
  return;
}

Assistant:

static void
htmlParseComment(htmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len;
    int size = HTML_PARSER_BUFFER_SIZE;
    int q, ql;
    int r, rl;
    int cur, l;
    int next, nl;
    xmlParserInputState state;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!') ||
        (NXT(2) != '-') || (NXT(3) != '-')) return;

    state = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    SHRINK;
    SKIP(4);
    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
        htmlErrMemory(ctxt, "buffer allocation failed\n");
	ctxt->instate = state;
	return;
    }
    len = 0;
    buf[len] = 0;
    q = CUR_CHAR(ql);
    if (q == 0)
        goto unfinished;
    if (q == '>') {
        htmlParseErr(ctxt, XML_ERR_COMMENT_ABRUPTLY_ENDED, "Comment abruptly ended", NULL, NULL);
        cur = '>';
        goto finished;
    }
    NEXTL(ql);
    r = CUR_CHAR(rl);
    if (r == 0)
        goto unfinished;
    if (q == '-' && r == '>') {
        htmlParseErr(ctxt, XML_ERR_COMMENT_ABRUPTLY_ENDED, "Comment abruptly ended", NULL, NULL);
        cur = '>';
        goto finished;
    }
    NEXTL(rl);
    cur = CUR_CHAR(l);
    while ((cur != 0) &&
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	NEXTL(l);
	next = CUR_CHAR(nl);
	if (next == 0) {
	    SHRINK;
	    GROW;
	    next = CUR_CHAR(nl);
	}

	if ((q == '-') && (r == '-') && (cur == '!') && (next == '>')) {
	  htmlParseErr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
		       "Comment incorrectly closed by '--!>'", NULL, NULL);
	  cur = '>';
	  break;
	}

	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
	        htmlErrMemory(ctxt, "growing buffer failed\n");
		ctxt->instate = state;
		return;
	    }
	    buf = tmp;
	}
        if (IS_CHAR(q)) {
	    COPY_BUF(ql,buf,len,q);
        } else {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in comment 0x%X\n", q);
        }

	q = r;
	ql = rl;
	r = cur;
	rl = l;
	cur = next;
	l = nl;
    }
finished:
    buf[len] = 0;
    if (cur == '>') {
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
	xmlFree(buf);
	ctxt->instate = state;
	return;
    }

unfinished:
    htmlParseErr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
		 "Comment not terminated \n<!--%.50s\n", buf, NULL);
    xmlFree(buf);
}